

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int encode_string(char *dst,size_t dst_len,argon2_context *ctx,argon2_type type)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  char tmp [30];
  char acStack_48 [32];
  
  pcVar2 = argon2_type2string(type,0);
  iVar1 = validate_inputs(ctx);
  if (pcVar2 != (char *)0x0) {
    if (iVar1 != 0) {
      return iVar1;
    }
    if (1 < dst_len) {
      dst[0] = '$';
      dst[1] = '\0';
      sVar3 = strlen(pcVar2);
      uVar8 = (dst_len - 1) - sVar3;
      if (sVar3 <= dst_len - 1 && uVar8 != 0) {
        pcVar10 = dst + 1;
        memcpy(pcVar10,pcVar2,sVar3 + 1);
        if (3 < uVar8) {
          builtin_strncpy(dst + sVar3 + 1,"$v=",4);
          sprintf(acStack_48,"%lu",(ulong)ctx->version);
          sVar4 = strlen(acStack_48);
          uVar9 = (uVar8 - 3) - sVar4;
          if (sVar4 <= uVar8 - 3 && uVar9 != 0) {
            pcVar10 = pcVar10 + sVar3 + 3;
            memcpy(pcVar10,acStack_48,sVar4 + 1);
            if (3 < uVar9) {
              builtin_strncpy(dst + sVar4 + sVar3 + 4,"$m=",4);
              sprintf(acStack_48,"%lu",(ulong)ctx->m_cost);
              sVar5 = strlen(acStack_48);
              uVar8 = (uVar9 - 3) - sVar5;
              if (sVar5 <= uVar9 - 3 && uVar8 != 0) {
                pcVar10 = pcVar10 + sVar4 + 3;
                memcpy(pcVar10,acStack_48,sVar5 + 1);
                if (3 < uVar8) {
                  builtin_strncpy(dst + sVar5 + sVar4 + sVar3 + 7,",t=",4);
                  sprintf(acStack_48,"%lu",(ulong)ctx->t_cost);
                  sVar6 = strlen(acStack_48);
                  uVar9 = (uVar8 - 3) - sVar6;
                  if (sVar6 <= uVar8 - 3 && uVar9 != 0) {
                    memcpy(pcVar10 + sVar5 + 3,acStack_48,sVar6 + 1);
                    if (3 < uVar9) {
                      builtin_strncpy(dst + sVar6 + sVar5 + sVar4 + sVar3 + 10,",p=",4);
                      sprintf(acStack_48,"%lu",(ulong)ctx->lanes);
                      sVar3 = strlen(acStack_48);
                      uVar8 = (uVar9 - 3) - sVar3;
                      if (sVar3 <= uVar9 - 3 && uVar8 != 0) {
                        pcVar2 = pcVar10 + sVar5 + 3 + sVar6 + 3;
                        memcpy(pcVar2,acStack_48,sVar3 + 1);
                        if (1 < uVar8) {
                          (pcVar2 + sVar3)[0] = '$';
                          (pcVar2 + sVar3)[1] = '\0';
                          pcVar2 = pcVar2 + sVar3 + 1;
                          sVar7 = to_base64(pcVar2,uVar8 - 1,ctx->salt,(ulong)ctx->saltlen);
                          if (sVar7 != 0xffffffffffffffff) {
                            uVar8 = (uVar8 - 1) - sVar7;
                            if (uVar8 < 2) {
                              return -0x1f;
                            }
                            (pcVar2 + sVar7)[0] = '$';
                            (pcVar2 + sVar7)[1] = '\0';
                            sVar7 = to_base64(pcVar2 + sVar7 + 1,uVar8 - 1,ctx->out,
                                              (ulong)ctx->outlen);
                            if (sVar7 == 0xffffffffffffffff) {
                              return -0x1f;
                            }
                            return 0;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return -0x1f;
}

Assistant:

int encode_string(char *dst, size_t dst_len, argon2_context *ctx,
                  argon2_type type) {
#define SS(str)                                                                \
    do {                                                                       \
        size_t pp_len = strlen(str);                                           \
        if (pp_len >= dst_len) {                                               \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        memcpy(dst, str, pp_len + 1);                                          \
        dst += pp_len;                                                         \
        dst_len -= pp_len;                                                     \
    } while ((void)0, 0)

#define SX(x)                                                                  \
    do {                                                                       \
        char tmp[30];                                                          \
        sprintf(tmp, "%lu", (unsigned long)(x));                               \
        SS(tmp);                                                               \
    } while ((void)0, 0)

#define SB(buf, len)                                                           \
    do {                                                                       \
        size_t sb_len = to_base64(dst, dst_len, buf, len);                     \
        if (sb_len == (size_t)-1) {                                            \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        dst += sb_len;                                                         \
        dst_len -= sb_len;                                                     \
    } while ((void)0, 0)

    const char* type_string = argon2_type2string(type, 0);
    int validation_result = validate_inputs(ctx);

    if (!type_string) {
        return ARGON2_ENCODING_FAIL;
    }

    if (validation_result != ARGON2_OK) {
        return validation_result;
    }

    SS("$");
    SS(type_string);

    SS("$v=");
    SX(ctx->version);

    SS("$m=");
    SX(ctx->m_cost);
    SS(",t=");
    SX(ctx->t_cost);
    SS(",p=");
    SX(ctx->lanes);

    SS("$");
    SB(ctx->salt, ctx->saltlen);

    SS("$");
    SB(ctx->out, ctx->outlen);
    return ARGON2_OK;

#undef SS
#undef SX
#undef SB
}